

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall duckdb::CheckpointTask::~CheckpointTask(CheckpointTask *this)

{
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(this->super_BaseCheckpointTask).super_BaseExecutorTask.super_Task.
                     super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
                     super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> + 8));
  operator_delete(this);
  return;
}

Assistant:

CheckpointTask(CollectionCheckpointState &checkpoint_state, idx_t index)
	    : BaseCheckpointTask(checkpoint_state), index(index) {
	}